

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::_clear_range(Tree *this,size_t first,size_t num)

{
  ulong uVar1;
  pfn_error p_Var2;
  NodeData *pNVar3;
  code *pcVar4;
  Location LVar5;
  bool bVar6;
  size_t e;
  long lVar7;
  csubstr cVar8;
  char *pcStack_78;
  size_t local_70;
  char msg [51];
  
  if (num != 0) {
    uVar1 = num + first;
    if (this->m_cap < uVar1) {
      builtin_strncpy(msg,"check failed: (first >= 0 && first + num <= m_cap)",0x33);
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      p_Var2 = (this->m_callbacks).m_error;
      cVar8 = to_csubstr(
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                        );
      local_70 = cVar8.len;
      pcStack_78 = cVar8.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x636f) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x636f) << 0x40,8);
      LVar5.name.str = pcStack_78;
      LVar5.name.len = local_70;
      (*p_Var2)(msg,0x33,LVar5,(this->m_callbacks).m_user_data);
    }
    memset(this->m_buf + first,0,num * 0x90);
    lVar7 = first * 0x90 + 0x88;
    while (first < uVar1) {
      _clear(this,first);
      pNVar3 = this->m_buf;
      *(size_t *)((long)&(pNVar3->m_type).type + lVar7) = first - 1;
      first = first + 1;
      *(size_t *)((long)pNVar3 + lVar7 + -8) = first;
      lVar7 = lVar7 + 0x90;
    }
    this->m_buf[uVar1 - 1].m_next_sibling = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void Tree::_clear_range(size_t first, size_t num)
{
    if(num == 0)
        return; // prevent overflow when subtracting
    _RYML_CB_ASSERT(m_callbacks, first >= 0 && first + num <= m_cap);
    memset(m_buf + first, 0, num * sizeof(NodeData)); // TODO we should not need this
    for(size_t i = first, e = first + num; i < e; ++i)
    {
        _clear(i);
        NodeData *n = m_buf + i;
        n->m_prev_sibling = i - 1;
        n->m_next_sibling = i + 1;
    }
    m_buf[first + num - 1].m_next_sibling = NONE;
}